

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

void __thiscall
capnp::SchemaParser::ModuleImpl::addError
          (ModuleImpl *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  int iVar1;
  Vector<unsigned_int> *pVVar2;
  anon_unknown_31 *this_00;
  SchemaFile *pSVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 in_R9;
  undefined4 local_58;
  undefined4 uStack_50;
  
  if ((this->lineBreaks).once.futex != 3) {
    kj::_::Once::runOnce();
  }
  pVVar2 = (this->lineBreaks).value.ptr;
  sVar4 = anon_unknown_31::findLargestElementBefore<unsigned_int>
                    ((anon_unknown_31 *)(pVVar2->builder).ptr,
                     (Vector<unsigned_int> *)(pVVar2->builder).pos,(uint *)(ulong)startByte);
  this_00 = (anon_unknown_31 *)(pVVar2->builder).ptr;
  iVar1 = *(int *)(this_00 + (sVar4 & 0xffffffff) * 4);
  sVar5 = anon_unknown_31::findLargestElementBefore<unsigned_int>
                    (this_00,(Vector<unsigned_int> *)(pVVar2->builder).pos,(uint *)(ulong)endByte);
  pSVar3 = (this->file).ptr;
  local_58 = message.content.ptr._0_4_;
  uStack_50 = (undefined4)message.content.size_;
  (*pSVar3->_vptr_SchemaFile[5])
            (pSVar3,(ulong)startByte | sVar4 << 0x20,(ulong)(startByte - iVar1),
             (ulong)endByte | sVar5 << 0x20,
             (ulong)(endByte - (pVVar2->builder).ptr[sVar5 & 0xffffffff]),in_R9,local_58,uStack_50);
  this->parser->hadErrors = true;
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
    auto& lines = lineBreaks.get(
        [](kj::SpaceFor<kj::Vector<uint>>& space) {
          KJ_FAIL_REQUIRE("Can't report errors until loadContent() is called.");
          return space.construct();
        });

    // TODO(someday):  This counts tabs as single characters.  Do we care?
    uint startLine = findLargestElementBefore(lines, startByte);
    uint startCol = startByte - lines[startLine];
    uint endLine = findLargestElementBefore(lines, endByte);
    uint endCol = endByte - lines[endLine];

    file->reportError(
        SchemaFile::SourcePos { startByte, startLine, startCol },
        SchemaFile::SourcePos { endByte, endLine, endCol },
        message);

    // We intentionally only set hadErrors true if reportError() didn't throw.
    parser.hadErrors = true;
  }